

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newmem.c
# Opt level: O2

void do_memtest(CHAR_DATA *ch,char *argument)

{
  allocator<char> local_1252;
  allocator<char> local_1251;
  CHAR_DATA *ch_local;
  string local_1248;
  string local_1228;
  char buf [4608];
  
  ch_local = ch;
  one_argument(argument,buf);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1228,"do_memtest",&local_1251)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1248,"do_bash_queue",&local_1252);
  CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[10]>
            (&RS.Queue,6,&local_1228,&local_1248,do_bash_queue,&ch_local,(char (*) [10])"Calenduil")
  ;
  std::__cxx11::string::~string((string *)&local_1248);
  std::__cxx11::string::~string((string *)&local_1228);
  return;
}

Assistant:

void do_memtest(CHAR_DATA *ch, char *argument)
{
	char buf[MSL];
	CHAR_DATA *qch;
	argument = one_argument(argument, buf);
	RS.Queue.AddToQueue(6, "do_memtest", "do_bash_queue", do_bash_queue, ch, "Calenduil");
	return;

	//TODO: what the what???

	if(buf[0]=='\0' || !argument || !is_number(argument))
		return;
	if(number_percent()> (.2 * get_skill(ch,gsn_rage)))
	{
		sprintf(buf,"%f is the value.\n\r",.2 * get_skill(ch,gsn_rage));
		send_to_char(buf,ch);
	}
	return;
	if(!str_cmp(buf,"dammod"))
	{
		for(qch = char_list; qch; qch = qch->next)
			if(is_npc(qch) && qch->pIndexData->vnum == 3001)
				qch->dam_mod = atoi(argument);
		send_to_char("Dammod changed.\n\r",ch);
	}
	if(!str_cmp(buf,"hp"))
	{
		for(qch = char_list; qch; qch = qch->next)
			if(is_npc(qch) && qch->pIndexData->vnum == 3001)
				qch->max_hit = std::max(qch->max_hit - atoi(argument), 100);
		send_to_char("Maxhit changed.\n\r",ch);
	}
	if(!str_cmp(buf,"begin"))
	{
		for(qch = char_list; qch; qch = qch->next)
			if(is_npc(qch) && qch->pIndexData->vnum == 3001 && !is_affected_by(qch, AFF_DETECT_MAGIC))
				SET_BIT(qch->affected_by, AFF_DETECT_MAGIC);
		send_to_char("It HAS BEGUN!\n\r",ch);
	}
	if(!str_cmp(buf,"end"))
	{
		for(qch = char_list; qch; qch = qch->next)
			if(is_npc(qch) && qch->pIndexData->vnum == 3001 && qch->in_room->vnum > 2399 &&
			   qch->in_room->vnum < 2801)
				extract_char(qch, true);
		send_to_char("It has.. ENDED!\n\r",ch);
	}
}